

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAdvancedBlendTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::AdvancedBlendCase::AdvancedBlendCase
          (AdvancedBlendCase *this,Context *context,char *name,char *desc,deUint32 mode,
          int overdrawCount,bool coherent,RenderTargetType rtType)

{
  int iVar1;
  RenderTarget *pRVar2;
  int local_7c;
  int local_5c;
  bool coherent_local;
  int overdrawCount_local;
  deUint32 mode_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  AdvancedBlendCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__AdvancedBlendCase_032cb4e8;
  this->m_blendMode = mode;
  this->m_overdrawCount = overdrawCount;
  this->m_coherentBlending = coherent;
  this->m_rtType = rtType;
  this->m_numIters = 5;
  this->m_colorRbo = 0;
  this->m_fbo = 0;
  this->m_resolveColorRbo = 0;
  this->m_resolveFbo = 0;
  this->m_program = (ShaderProgram *)0x0;
  this->m_referenceRenderer = (ReferenceQuadRenderer *)0x0;
  this->m_refColorBuffer = (TextureLevel *)0x0;
  if (rtType == RENDERTARGETTYPE_DEFAULT) {
    pRVar2 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    local_5c = tcu::RenderTarget::getWidth(pRVar2);
  }
  else {
    local_5c = 0x100;
  }
  this->m_renderWidth = local_5c;
  if (rtType == RENDERTARGETTYPE_DEFAULT) {
    pRVar2 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    local_7c = tcu::RenderTarget::getHeight(pRVar2);
  }
  else {
    local_7c = 0x100;
  }
  this->m_renderHeight = local_7c;
  iVar1 = de::min<int>(this->m_renderWidth,0x80);
  this->m_viewportWidth = iVar1;
  iVar1 = de::min<int>(this->m_renderHeight,0x80);
  this->m_viewportHeight = iVar1;
  this->m_iterNdx = 0;
  return;
}

Assistant:

AdvancedBlendCase::AdvancedBlendCase (Context&			context,
									  const char*		name,
									  const char*		desc,
									  deUint32			mode,
									  int				overdrawCount,
									  bool				coherent,
									  RenderTargetType	rtType)
	: TestCase				(context, name, desc)
	, m_blendMode			(mode)
	, m_overdrawCount		(overdrawCount)
	, m_coherentBlending	(coherent)
	, m_rtType				(rtType)
	, m_numIters			(5)
	, m_colorRbo			(0)
	, m_fbo					(0)
	, m_resolveColorRbo		(0)
	, m_resolveFbo			(0)
	, m_program				(DE_NULL)
	, m_referenceRenderer	(DE_NULL)
	, m_refColorBuffer		(DE_NULL)
	, m_renderWidth			(rtType != RENDERTARGETTYPE_DEFAULT ? 2*MAX_VIEWPORT_WIDTH	: m_context.getRenderTarget().getWidth())
	, m_renderHeight		(rtType != RENDERTARGETTYPE_DEFAULT ? 2*MAX_VIEWPORT_HEIGHT	: m_context.getRenderTarget().getHeight())
	, m_viewportWidth		(de::min<int>(m_renderWidth,	MAX_VIEWPORT_WIDTH))
	, m_viewportHeight		(de::min<int>(m_renderHeight,	MAX_VIEWPORT_HEIGHT))
	, m_iterNdx				(0)
{
}